

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

void google::protobuf::internal::LogIndexOutOfBoundsAndAbort(int index,int size)

{
  LogMessage *pLVar1;
  LogMessage local_28;
  Voidify local_11;
  int local_10;
  int local_c;
  int size_local;
  int index_local;
  
  local_10 = size;
  local_c = index;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.cc"
             ,0x25);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [8])"index: ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_c);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [9])", size: ")
  ;
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_10);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

[[noreturn]] void LogIndexOutOfBoundsAndAbort(int index, int size) {
  ABSL_LOG(FATAL) << "index: " << index << ", size: " << size;
}